

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::RunProtocWithArgs
          (CommandLineInterfaceTester *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  value_type pcVar5;
  reference ppcVar6;
  char **argv_00;
  size_type in_R9;
  undefined1 auVar7 [16];
  string_view s;
  FixedMapping replacements;
  string local_f0 [32];
  string local_d0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string local_70;
  ulong local_50;
  size_t i;
  allocator<const_char_*> local_31;
  undefined1 local_30 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  CommandLineInterfaceTester *this_local;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  std::allocator<const_char_*>::allocator(&local_31);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,sVar3,&local_31);
  std::allocator<const_char_*>::~allocator(&local_31);
  local_50 = 0;
  while( true ) {
    uVar1 = local_50;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar3 <= uVar1) break;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,local_50);
    auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
    local_80 = auVar7;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_b0,(char (*) [8])"$tmpdir",&this->temp_directory_);
    local_90 = &local_b0;
    local_88 = 1;
    s._M_str = (char *)local_90;
    s._M_len = local_80._8_8_;
    replacements._M_len = in_R9;
    replacements._M_array = (iterator)0x1;
    absl::lts_20250127::StrReplaceAll_abi_cxx11_
              (&local_70,(lts_20250127 *)local_80._0_8_,s,replacements);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,local_50);
    std::__cxx11::string::operator=((string *)pvVar4,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,local_50);
    pcVar5 = (value_type)std::__cxx11::string::c_str();
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,local_50);
    *ppcVar6 = pcVar5;
    local_50 = local_50 + 1;
  }
  CaptureTestStdout();
  CaptureTestStderr();
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  argv_00 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  iVar2 = CommandLineInterface::Run(&this->cli_,(int)sVar3,argv_00);
  this->return_code_ = iVar2;
  GetCapturedTestStderr_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->captured_stderr_,local_d0);
  std::__cxx11::string::~string(local_d0);
  GetCapturedTestStdout_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->captured_stdout_,local_f0);
  std::__cxx11::string::~string(local_f0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  return;
}

Assistant:

void CommandLineInterfaceTester::RunProtocWithArgs(
    std::vector<std::string> args) {
  std::vector<const char*> argv(args.size());

  for (size_t i = 0; i < args.size(); i++) {
    args[i] = absl::StrReplaceAll(args[i], {{"$tmpdir", temp_directory_}});
    argv[i] = args[i].c_str();
  }

  // TODO: Cygwin doesn't work well if we try to capture stderr and
  // stdout at the same time. Need to figure out why and add this capture back
  // for Cygwin.
#if !defined(__CYGWIN__)
  CaptureTestStdout();
#endif
  CaptureTestStderr();

  return_code_ = cli_.Run(static_cast<int>(args.size()), argv.data());

  captured_stderr_ = GetCapturedTestStderr();
#if !defined(__CYGWIN__)
  captured_stdout_ = GetCapturedTestStdout();
#endif
}